

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
PlayerTableIRCCommand::trigger
          (PlayerTableIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  Server *pSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Server *pSVar8;
  long lVar9;
  Server *pSVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  long *plVar13;
  char *pcVar14;
  _Node *__temp_2;
  undefined8 *puVar15;
  bool bVar16;
  Server *pSVar17;
  size_t sVar18;
  uint uVar19;
  size_t sVar20;
  _Node *__temp;
  ulong uVar21;
  long *plVar22;
  size_t sVar23;
  _Node *__temp_1;
  undefined1 auVar24 [16];
  string_view color;
  string_view color_00;
  string_view color_01;
  ulong local_e8;
  string_view channel_local;
  anon_class_64_8_03ae175d output_player;
  double local_88;
  double dStack_80;
  
  pcVar14 = channel._M_str;
  sVar18 = channel._M_len;
  channel_local._M_len = sVar18;
  channel_local._M_str = pcVar14;
  Jupiter::IRC::Client::getChannel(source,sVar18,pcVar14,pcVar14,nick._M_len,nick._M_str);
  iVar5 = Jupiter::IRC::Client::Channel::getType();
  color = (string_view)RenX::getTeamColor(GDI);
  color_00 = (string_view)RenX::getTeamColor(Nod);
  color_01 = (string_view)RenX::getTeamColor(Other);
  RenX::getTeamName(GDI);
  RenX::getTeamName(Nod);
  RenX::getTeamName(Other);
  RenX::getCore();
  lVar6 = RenX::Core::getServerCount();
  if (lVar6 != 0) {
    bVar16 = true;
    uVar21 = 0;
    do {
      uVar7 = RenX::getCore();
      pSVar8 = (Server *)RenX::Core::getServer(uVar7);
      cVar4 = RenX::Server::isLogChanType((int)pSVar8);
      if (cVar4 != '\0') {
        lVar6 = *(long *)(pSVar8 + 0x20);
        lVar9 = RenX::Server::getBotCount();
        if (lVar6 == lVar9) {
          Jupiter::IRC::Client::sendMessage
                    (source,channel_local._M_len,channel_local._M_str,0x17,"No players are in-game."
                    );
          bVar16 = false;
        }
        else {
          pSVar10 = pSVar8 + 0x10;
          pSVar17 = *(Server **)pSVar10;
          if (pSVar17 == pSVar10) {
            local_e8 = 8;
            uVar19 = 999;
            plVar22 = (long *)0x0;
            puVar11 = (undefined8 *)0x0;
            puVar15 = (undefined8 *)0x0;
            local_88 = 99999.0;
            dStack_80 = 9999999.0;
          }
          else {
            uVar19 = 999;
            local_e8 = 8;
            puVar15 = (undefined8 *)0x0;
            puVar11 = (undefined8 *)0x0;
            plVar22 = (long *)0x0;
            local_88 = 99999.0;
            dStack_80 = 9999999.0;
            do {
              if (pSVar17[0x110] == (Server)0x0) {
                pSVar1 = pSVar17 + 0x10;
                if (local_e8 < *(ulong *)(pSVar17 + 0x20)) {
                  local_e8 = *(ulong *)(pSVar17 + 0x20);
                }
                if ((int)uVar19 < (int)*(uint *)(pSVar17 + 0x10c)) {
                  uVar19 = *(uint *)(pSVar17 + 0x10c);
                }
                auVar24._8_8_ = dStack_80;
                auVar24._0_8_ = local_88;
                auVar24 = maxpd(*(undefined1 (*) [16])(pSVar17 + 0x118),auVar24);
                if (*(int *)(pSVar17 + 0x108) == 1) {
                  puVar12 = (undefined8 *)operator_new(0x10);
                  puVar12[1] = pSVar1;
                  *puVar12 = puVar11;
                }
                else {
                  puVar12 = puVar11;
                  if (*(int *)(pSVar17 + 0x108) == 0) {
                    puVar11 = (undefined8 *)operator_new(0x10);
                    puVar11[1] = pSVar1;
                    *puVar11 = puVar15;
                    puVar15 = puVar11;
                  }
                  else {
                    plVar13 = (long *)operator_new(0x10);
                    plVar13[1] = (long)pSVar1;
                    *plVar13 = (long)plVar22;
                    plVar22 = plVar13;
                  }
                }
                local_88 = auVar24._0_8_;
                dStack_80 = auVar24._8_8_;
                puVar11 = puVar12;
              }
              pSVar17 = *(Server **)pSVar17;
            } while (pSVar17 != pSVar10);
          }
          sVar18 = 1;
          do {
            sVar18 = sVar18 + 1;
            bVar16 = 99 < uVar19;
            uVar19 = uVar19 / 10;
          } while (bVar16);
          sVar20 = 0;
          do {
            local_88 = local_88 / 10.0;
            sVar20 = sVar20 + 1;
          } while (1.0 <= local_88);
          sVar23 = 0;
          do {
            dStack_80 = dStack_80 / 10.0;
            sVar23 = sVar23 + 1;
          } while (1.0 <= dStack_80);
          cVar4 = RenX::Server::isAdminLogChanType((int)pSVar8);
          pcVar14 = channel_local._M_str;
          sVar3 = channel_local._M_len;
          if (cVar4 == '\0') {
            string_printf_abi_cxx11_
                      ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s",local_e8,
                       "Nickname",sVar18,"ID",sVar20,"Score",sVar23,"Credits");
            Jupiter::IRC::Client::sendMessage
                      (source,sVar3,pcVar14,CONCAT44(output_player._12_4_,output_player.type),
                       output_player.server);
          }
          else {
            string_printf_abi_cxx11_
                      ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s | IP Address",
                       local_e8,"Nickname",sVar18,"ID",sVar20,"Score",sVar23,"Credits");
            Jupiter::IRC::Client::sendMessage
                      (source,sVar3,pcVar14,CONCAT44(output_player._12_4_,output_player.type),
                       output_player.server);
          }
          if (output_player.server != (Server *)&output_player.source) {
            operator_delete(output_player.server,(ulong)(output_player.source + 1));
          }
          output_player.channel = &channel_local;
          output_player.idColLen = sVar18;
          output_player.scoreColLen = sVar20;
          output_player.creditColLen = sVar23;
          output_player.source = source;
          output_player.server = pSVar8;
          output_player.type = iVar5;
          output_player.maxNickLen = local_e8;
          for (puVar12 = puVar15; puVar2 = puVar11, puVar12 != (undefined8 *)0x0;
              puVar12 = (undefined8 *)*puVar12) {
            trigger::anon_class_64_8_03ae175d::operator()
                      (&output_player,(PlayerInfo *)puVar12[1],color);
          }
          for (; puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
            trigger::anon_class_64_8_03ae175d::operator()
                      (&output_player,(PlayerInfo *)puVar2[1],color_00);
          }
          plVar13 = plVar22;
          if (plVar22 != (long *)0x0) {
            do {
              trigger::anon_class_64_8_03ae175d::operator()
                        (&output_player,(PlayerInfo *)plVar13[1],color_01);
              plVar13 = (long *)*plVar13;
            } while (plVar13 != (long *)0x0);
            while (plVar22 != (long *)0x0) {
              plVar13 = (long *)*plVar22;
              operator_delete(plVar22,0x10);
              plVar22 = plVar13;
            }
          }
          while (puVar11 != (undefined8 *)0x0) {
            puVar12 = (undefined8 *)*puVar11;
            operator_delete(puVar11,0x10);
            puVar11 = puVar12;
          }
          while (puVar15 != (undefined8 *)0x0) {
            puVar11 = (undefined8 *)*puVar15;
            operator_delete(puVar15,0x10);
            puVar15 = puVar11;
          }
          bVar16 = false;
        }
      }
      uVar21 = (ulong)((int)uVar21 + 1);
      RenX::getCore();
      uVar7 = RenX::Core::getServerCount();
    } while (uVar7 != uVar21);
    pcVar14 = channel_local._M_str;
    sVar18 = channel_local._M_len;
    if (!bVar16) {
      return;
    }
  }
  Jupiter::IRC::Client::sendMessage
            (source,sVar18,pcVar14,0x40,
             "Error: Channel not attached to any connected Renegade X servers.");
  return;
}

Assistant:

void PlayerTableIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				std::forward_list<RenX::PlayerInfo *> gPlayers;
				std::forward_list<RenX::PlayerInfo *> nPlayers;
				std::forward_list<RenX::PlayerInfo *> oPlayers;

				size_t maxNickLen = 8;
				int highID = 999;
				double highScore = 99999.0;
				double highCredits = 9999999.0;

				RenX::PlayerInfo *player;
				for (auto node = server->players.begin(); node != server->players.end(); ++node)
				{
					player = &*node;
					if (player != nullptr && player->isBot == false)
					{
						if (player->name.size() > maxNickLen)
							maxNickLen = player->name.size();

						if (player->id > highID)
							highID = player->id;

						if (player->score > highScore)
							highScore = player->score;

						if (player->credits > highCredits)
							highCredits = player->credits;

						switch (player->team)
						{
						case RenX::TeamType::GDI:
							gPlayers.push_front(player);
							break;
						case RenX::TeamType::Nod:
							nPlayers.push_front(player);
							break;
						default:
							oPlayers.push_front(player);
							break;
						}
					}
				}

				size_t idColLen = 1, scoreColLen = 1, creditColLen = 1;

				while ((highID /= 10) > 0)
					++idColLen;

				while ((highScore /= 10) >= 1.0)
					++scoreColLen;

				while ((highCredits /= 10) >= 1.0)
					++creditColLen;

				if (server->isAdminLogChanType(type))
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s | IP Address", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));
				else
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));

				auto output_player = [server, type, source, &channel, maxNickLen, idColLen, scoreColLen, creditColLen](RenX::PlayerInfo *player, std::string_view color)
				{
					if (server->isAdminLogChanType(type))
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCNORMAL " %.*s", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits, player->ip.size(), player->ip.data()));
					else
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits));
				};

				for (auto node = gPlayers.begin(); node != gPlayers.end(); ++node)
					output_player(*node, gTeamColor);

				for (auto node = nPlayers.begin(); node != nPlayers.end(); ++node)
					output_player(*node, nTeamColor);

				for (auto node = oPlayers.begin(); node != oPlayers.end(); ++node)
					output_player(*node, oTeamColor);
			}
			else source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}